

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O3

void amrex::apply_eb_redistribution
               (Box *bx,MultiFab *div_mf,MultiFab *divc_mf,MultiFab *weights,MFIter *mfi,int icomp,
               int ncomp,EBCellFlagFab *flags_fab,MultiFab *volfrac,Box *param_10,Geometry *geom)

{
  Box *pBVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  Array4<const_double> local_1b0;
  Array4<const_double> local_170;
  Array4<const_amrex::EBCellFlag> local_130;
  Array4<const_double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  dVar2 = (geom->super_CoordSys).dx[0];
  dVar3 = (geom->super_CoordSys).dx[1];
  if ((ABS(dVar2 - dVar3) < 2.2250738585072014e-308) ||
     (dVar8 = ABS(dVar2 + dVar3) * 2.220446049250313e-16, ABS(dVar2 - dVar3) <= dVar8 + dVar8)) {
    dVar8 = (geom->super_CoordSys).dx[2];
    if (((ABS(dVar2 - dVar8) < 2.2250738585072014e-308) ||
        (dVar7 = ABS(dVar2 + dVar8) * 2.220446049250313e-16, ABS(dVar2 - dVar8) <= dVar7 + dVar7))
       && ((ABS(dVar3 - dVar8) < 2.2250738585072014e-308 ||
           (dVar2 = ABS(dVar3 + dVar8) * 2.220446049250313e-16, ABS(dVar3 - dVar8) <= dVar2 + dVar2)
           ))) goto LAB_005e69d6;
  }
  Abort_host("apply_eb_redistribution(): grid spacing must be uniform");
LAB_005e69d6:
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (&local_70,&div_mf->super_FabArray<amrex::FArrayBox>,mfi);
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (&local_b0,&divc_mf->super_FabArray<amrex::FArrayBox>,mfi);
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (&local_f0,&weights->super_FabArray<amrex::FArrayBox>,mfi);
  local_130.p = (flags_fab->super_BaseFab<amrex::EBCellFlag>).dptr;
  local_130.ncomp = (flags_fab->super_BaseFab<amrex::EBCellFlag>).nvar;
  pBVar1 = &(flags_fab->super_BaseFab<amrex::EBCellFlag>).domain;
  local_130.begin.z = (flags_fab->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
  local_130.begin.x = (pBVar1->smallend).vect[0];
  local_130.begin.y = (pBVar1->smallend).vect[1];
  lVar5 = (long)(flags_fab->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
  lVar6 = (long)(flags_fab->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
  lVar4 = (long)(flags_fab->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
  local_130.jstride = (lVar6 - (pBVar1->smallend).vect[0]) + 1;
  local_130.kstride =
       (lVar5 - (flags_fab->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
       local_130.jstride;
  local_130.nstride = (lVar4 - local_130.begin.z) * local_130.kstride;
  local_130.end._0_8_ = lVar6 + 1U & 0xffffffff | lVar5 << 0x20;
  local_130.end.z = (int)lVar4;
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (&local_170,&volfrac->super_FabArray<amrex::FArrayBox>,mfi);
  local_1b0.p = local_b0.p;
  local_1b0.jstride = local_b0.jstride;
  local_1b0.kstride = local_b0.kstride;
  local_1b0.nstride = local_b0.nstride;
  local_1b0.begin.x = local_b0.begin.x;
  local_1b0.begin.y = local_b0.begin.y;
  local_1b0.begin.z = local_b0.begin.z;
  local_1b0.end.x = local_b0.end.x;
  local_1b0.end.y = local_b0.end.y;
  local_1b0.end.z = local_b0.end.z;
  local_1b0.ncomp = local_b0.ncomp;
  apply_flux_redistribution
            (bx,&local_70,&local_1b0,&local_f0,icomp,ncomp,&local_130,&local_170,geom);
  return;
}

Assistant:

void apply_eb_redistribution ( const Box& bx,
                                   MultiFab& div_mf,
                                   MultiFab& divc_mf,
                                   const MultiFab& weights,
                                   MFIter* mfi,
                                   const int icomp,
                                   const int ncomp,
                                   const EBCellFlagFab& flags_fab,
                                   const MultiFab* volfrac,
                                   Box& /*domain*/,
                                   const Geometry & geom)
    {
        //
        // Check that grid is uniform
        //
        const Real* dx = geom.CellSize();

#if (AMREX_SPACEDIM == 2)
        if (! amrex::almostEqual(dx[0], dx[1]))
            amrex::Abort("apply_eb_redistribution(): grid spacing must be uniform");
#elif (AMREX_SPACEDIM == 3)
        if( ! amrex::almostEqual(dx[0],dx[1]) ||
            ! amrex::almostEqual(dx[0],dx[2]) ||
            ! amrex::almostEqual(dx[1],dx[2]) )
            amrex::Abort("apply_eb_redistribution(): grid spacing must be uniform");
#endif

        //
        // Get array4 from arguments
        //
        Array4<Real> const& div  = div_mf.array(*mfi);
        Array4<Real> const& divc = divc_mf.array(*mfi);
        auto const&         wt   = weights.array(*mfi);
        auto const&        flags = flags_fab.array();
        auto const&        vfrac = volfrac->array(*mfi);

        apply_flux_redistribution ( bx, div, divc, wt, icomp, ncomp, flags, vfrac, geom);
    }